

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtIO.c
# Opt level: O0

int NIOVfprintf(newtStream_t *stream,char *format,__va_list_tag *ap)

{
  _Bool _Var1;
  char local_128 [8];
  char wk [255];
  int result;
  __va_list_tag *ap_local;
  char *format_local;
  newtStream_t *stream_local;
  
  stack0xffffffffffffffdc = 0;
  _Var1 = NewtRefIsString(stream->obj);
  if (_Var1) {
    register0x00000000 = vsnprintf(local_128,0xff,format,ap);
    if (0 < (int)register0x00000000) {
      if (0xff < register0x00000000) {
        wk[0xf6] = '\0';
      }
      NewtStrCat(stream->obj,local_128);
    }
  }
  else {
    register0x00000000 = vfprintf((FILE *)stream->file,format,ap);
  }
  return stack0xffffffffffffffdc;
}

Assistant:

int NIOVfprintf(newtStream_t * stream, const char * format, va_list ap)
{
    int		result = 0;
    
    if (NewtRefIsString(stream->obj))
    {
        char	wk[NEWT_SNPRINTF_BUFFSIZE];
        
        result = vsnprintf(wk, sizeof(wk), format, ap);
        
        if (0 < result)
        {
            if (sizeof(wk) < result)
                wk[sizeof(wk) - 1] = '\0';
            
            NewtStrCat(stream->obj, wk);
        }
    }
    else
    {
        result = vfprintf(stream->file, format, ap);
    }
    
    return result;
}